

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O0

int * Dsc_ComputeMatches(char *p)

{
  int local_60;
  int local_5c;
  int nNested;
  int v;
  int pNested [16];
  char *p_local;
  
  local_60 = 0;
  local_5c = 0;
  while( true ) {
    if (p[local_5c] == '\0') {
      if (local_60 != 0) {
        __assert_fail("nNested == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dsc/dsc.c"
                      ,0x1d0,"int *Dsc_ComputeMatches(char *)");
      }
      return Dsc_ComputeMatches::pMatches;
    }
    Dsc_ComputeMatches::pMatches[local_5c] = 0;
    if ((((p[local_5c] == '(') || (p[local_5c] == '[')) || (p[local_5c] == '<')) ||
       (p[local_5c] == '{')) {
      (&nNested)[local_60] = local_5c;
      local_60 = local_60 + 1;
    }
    else if (((p[local_5c] == ')') || (p[local_5c] == ']')) ||
            ((p[local_5c] == '>' || (p[local_5c] == '}')))) {
      local_60 = local_60 + -1;
      Dsc_ComputeMatches::pMatches[(&nNested)[local_60]] = local_5c;
    }
    if (0xf < local_60) break;
    local_5c = local_5c + 1;
  }
  __assert_fail("nNested < DSC_MAX_VAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dsc/dsc.c"
                ,0x1ce,"int *Dsc_ComputeMatches(char *)");
}

Assistant:

int * Dsc_ComputeMatches( char * p )
{
    static int pMatches[DSC_MAX_VAR];
    int pNested[DSC_MAX_VAR];
    int v, nNested = 0;
    for ( v = 0; p[v]; v++ )
    {
        pMatches[v] = 0;
        if ( p[v] == '(' || p[v] == '[' || p[v] == '<' || p[v] == '{' )
            pNested[nNested++] = v;
        else if ( p[v] == ')' || p[v] == ']' || p[v] == '>' || p[v] == '}' )
            pMatches[pNested[--nNested]] = v;
        assert( nNested < DSC_MAX_VAR );
    }
    assert( nNested == 0 );
    return pMatches;
}